

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall caffe::Datum::MergePartialFromCodedStream(Datum *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  UnknownFieldSet *unknown_fields;
  char cVar9;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ac5ca;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ac5ca:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_003ac646_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar10 = (ulong)bVar1;
        uVar7 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ac83d;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_003ac83d:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar10;
      }
      iVar8 = 6;
      if (bVar6) {
        this->channels_ = (int32)uVar10;
        goto LAB_003ac624;
      }
      goto LAB_003ac626;
    case 2:
      if (cVar9 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar10 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ac863;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar7 = 0;
LAB_003ac863:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar6 = -1 < (long)uVar10;
        }
        iVar8 = 6;
        if (bVar6) {
          this->height_ = (int32)uVar10;
          goto LAB_003ac624;
        }
        goto LAB_003ac626;
      }
      break;
    case 3:
      if (cVar9 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar10 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003ac817;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar7 = 0;
LAB_003ac817:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar6 = -1 < (long)uVar10;
        }
        iVar8 = 6;
        if (bVar6) {
          this->width_ = (int32)uVar10;
          goto LAB_003ac624;
        }
        goto LAB_003ac626;
      }
      break;
    case 4:
      if (cVar9 != '\"') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->data_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&this->data_,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,(this->data_).ptr_);
      goto LAB_003ac61d;
    case 5:
      if (cVar9 != '(') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar10 = (ulong)bVar1;
        uVar7 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ac7f1;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_003ac7f1:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar10;
      }
      iVar8 = 6;
      if (!bVar6) goto LAB_003ac626;
      this->label_ = (int32)uVar10;
      goto LAB_003ac624;
    case 6:
      if (cVar9 == '2') {
        bVar6 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->float_data_);
      }
      else {
        if ((tag & 0xff) != 0x35) break;
        bVar6 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (1,0x35,input,&this->float_data_);
      }
      goto LAB_003ac61d;
    case 7:
      if (cVar9 == '8') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar11._8_8_ = 1;
          pVar11.first = (long)(char)uVar2;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar8 = 6;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->encoded_ = pVar11.first != 0;
          goto LAB_003ac624;
        }
        goto LAB_003ac626;
      }
    }
switchD_003ac646_default:
    iVar8 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_003ac61d:
      iVar8 = 6;
      if (bVar6 != false) {
LAB_003ac624:
        iVar8 = 0;
      }
    }
LAB_003ac626:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool Datum::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.Datum)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 channels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_channels();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 width = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bytes data = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_data()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 label = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_label();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &label_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float float_data = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(53u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 53u, input, this->mutable_float_data())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_float_data())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool encoded = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_encoded();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &encoded_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.Datum)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.Datum)
  return false;
#undef DO_
}